

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O2

unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
__thiscall
duckdb::CompressedMaterialization::GetStringCompress
          (CompressedMaterialization *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *input,
          BaseStatistics *stats)

{
  bool bVar1;
  byte value;
  uint32_t uVar2;
  idx_t iVar3;
  BaseStatistics *in_RCX;
  BaseStatistics *stats_00;
  BaseStatistics *stats_01;
  ushort uVar4;
  LogicalType cast_type;
  string min_string;
  LogicalType local_288;
  LogicalType local_270;
  string max_string;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  arguments;
  Value max_val;
  BaseStatistics compress_stats;
  ScalarFunction compress_function;
  
  bVar1 = StringStats::HasMaxStringLength(in_RCX);
  if (bVar1) {
    uVar2 = StringStats::MaxStringLength(in_RCX);
    LogicalType::LogicalType(&cast_type,INVALID);
    CMUtils::StringTypes();
    for (; compress_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
           _vptr_Function !=
           (_func_int **)
           compress_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
           _M_dataplus._M_p;
        compress_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
        _vptr_Function =
             (_func_int **)
             ((long)compress_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                    _vptr_Function + 0x18)) {
      iVar3 = GetTypeIdSize(((LogicalType *)
                            compress_function.super_BaseScalarFunction.super_SimpleFunction.
                            super_Function._vptr_Function)->physical_type_);
      if (uVar2 < iVar3) {
        LogicalType::operator=
                  (&cast_type,
                   (LogicalType *)
                   compress_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                   _vptr_Function);
        break;
      }
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               &compress_function);
    LogicalType::LogicalType((LogicalType *)&compress_function,INVALID);
    bVar1 = LogicalType::operator==(&cast_type,(LogicalType *)&compress_function);
    LogicalType::~LogicalType((LogicalType *)&compress_function);
    if (bVar1) {
      this->optimizer = (Optimizer *)0x0;
    }
    else {
      LogicalType::LogicalType(&local_270,&cast_type);
      BaseStatistics::CreateEmpty(&compress_stats,&local_270);
      LogicalType::~LogicalType(&local_270);
      BaseStatistics::CopyBase(&compress_stats,in_RCX);
      if (cast_type.id_ == USMALLINT) {
        StringStats::Min_abi_cxx11_(&min_string,(StringStats *)in_RCX,stats_00);
        StringStats::Max_abi_cxx11_(&max_string,(StringStats *)in_RCX,stats_01);
        if (uVar2 == 0) {
          value = 0;
          uVar4 = 0;
        }
        else {
          uVar4 = 0;
          if (min_string._M_string_length == 0) {
            value = 0;
          }
          else {
            value = *min_string._M_dataplus._M_p;
          }
          if (max_string._M_string_length != 0) {
            uVar4 = (ushort)(byte)*max_string._M_dataplus._M_p;
          }
        }
        Value::USMALLINT((Value *)&arguments,(ushort)value);
        Value::USMALLINT(&max_val,uVar4 + 1);
        if (uVar4 != 0xff) {
          LogicalType::LogicalType((LogicalType *)&compress_function,UTINYINT);
          LogicalType::operator=(&cast_type,(LogicalType *)&compress_function);
          LogicalType::~LogicalType((LogicalType *)&compress_function);
          LogicalType::LogicalType(&local_288,&cast_type);
          BaseStatistics::CreateEmpty((BaseStatistics *)&compress_function,&local_288);
          BaseStatistics::operator=(&compress_stats,(BaseStatistics *)&compress_function);
          BaseStatistics::~BaseStatistics((BaseStatistics *)&compress_function);
          LogicalType::~LogicalType(&local_288);
          BaseStatistics::CopyBase(&compress_stats,in_RCX);
          Value::UTINYINT((Value *)&compress_function,value);
          Value::operator=((Value *)&arguments,(Value *)&compress_function);
          Value::~Value((Value *)&compress_function);
          Value::UTINYINT((Value *)&compress_function,(uint8_t)(uVar4 + 1));
          Value::operator=(&max_val,(Value *)&compress_function);
          Value::~Value((Value *)&compress_function);
        }
        NumericStats::SetMin(&compress_stats,(Value *)&arguments);
        NumericStats::SetMax(&compress_stats,&max_val);
        Value::~Value(&max_val);
        Value::~Value((Value *)&arguments);
        ::std::__cxx11::string::~string((string *)&max_string);
        ::std::__cxx11::string::~string((string *)&min_string);
      }
      CMStringCompressFun::GetFunction(&compress_function,&cast_type);
      arguments.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      arguments.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      arguments.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&arguments,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 stats);
      min_string._M_dataplus._M_p = (pointer)0x0;
      make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr)>
                (&max_val.type_,(ScalarFunction *)&cast_type,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)&compress_function,(void **)&arguments);
      BaseStatistics::ToUnique((BaseStatistics *)&min_string);
      make_uniq<duckdb::CompressExpression,duckdb::unique_ptr<duckdb::BoundFunctionExpression,std::default_delete<duckdb::BoundFunctionExpression>,true>,duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                ((duckdb *)this,
                 (unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                  *)&max_val,
                 (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)&min_string);
      ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
      ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                   *)&min_string);
      if (max_val.type_._0_8_ != 0) {
        (**(code **)(*(long *)max_val.type_._0_8_ + 8))();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&arguments);
      ScalarFunction::~ScalarFunction(&compress_function);
      BaseStatistics::~BaseStatistics(&compress_stats);
    }
    LogicalType::~LogicalType(&cast_type);
  }
  else {
    this->optimizer = (Optimizer *)0x0;
  }
  return (unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>)
         (unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>)
         this;
}

Assistant:

unique_ptr<CompressExpression> CompressedMaterialization::GetStringCompress(unique_ptr<Expression> input,
                                                                            const BaseStatistics &stats) {
	if (!StringStats::HasMaxStringLength(stats)) {
		return nullptr;
	}

	const auto max_string_length = StringStats::MaxStringLength(stats);
	LogicalType cast_type = LogicalType::INVALID;
	for (const auto &compressed_type : CMUtils::StringTypes()) {
		if (max_string_length < GetTypeIdSize(compressed_type.InternalType())) {
			cast_type = compressed_type;
			break;
		}
	}
	if (cast_type == LogicalType::INVALID) {
		return nullptr;
	}

	auto compress_stats = BaseStatistics::CreateEmpty(cast_type);
	compress_stats.CopyBase(stats);
	if (cast_type.id() == LogicalTypeId::USMALLINT) {
		auto min_string = StringStats::Min(stats);
		auto max_string = StringStats::Max(stats);

		uint8_t min_numeric = 0;
		if (max_string_length != 0 && !min_string.empty()) {
			min_numeric = *reinterpret_cast<const uint8_t *>(min_string.c_str());
		}
		uint8_t max_numeric = 0;
		if (max_string_length != 0 && !max_string.empty()) {
			max_numeric = *reinterpret_cast<const uint8_t *>(max_string.c_str());
		}

		Value min_val = Value::USMALLINT(min_numeric);
		Value max_val = Value::USMALLINT(max_numeric + 1);
		if (max_numeric < NumericLimits<uint8_t>::Maximum()) {
			cast_type = LogicalType::UTINYINT;
			compress_stats = BaseStatistics::CreateEmpty(cast_type);
			compress_stats.CopyBase(stats);
			min_val = Value::UTINYINT(min_numeric);
			max_val = Value::UTINYINT(max_numeric + 1);
		}

		NumericStats::SetMin(compress_stats, min_val);
		NumericStats::SetMax(compress_stats, max_val);
	}

	auto compress_function = CMStringCompressFun::GetFunction(cast_type);
	vector<unique_ptr<Expression>> arguments;
	arguments.emplace_back(std::move(input));
	auto compress_expr =
	    make_uniq<BoundFunctionExpression>(cast_type, compress_function, std::move(arguments), nullptr);
	return make_uniq<CompressExpression>(std::move(compress_expr), compress_stats.ToUnique());
}